

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTarget * __thiscall
cmMakefile::AddUtilityCommand
          (cmMakefile *this,string *utilityName,TargetOrigin origin,bool excludeFromAll,
          char *workingDirectory,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,bool escapeOldStyle,char *comment,
          bool uses_terminal,bool command_expand_lists,string *job_pool)

{
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  cmTarget *this_00;
  char *pcVar4;
  string *psVar5;
  cmSourceFile *pcVar6;
  undefined7 in_register_00000009;
  string *byproduct;
  char *__end;
  string local_c8;
  cmMakefile *local_a8;
  string no_main_dependency;
  string force;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forced;
  
  local_a8 = this;
  this_00 = AddNewTarget(this,UTILITY,utilityName);
  cmTarget::SetIsGeneratorProvided(this_00,origin == Generator);
  if ((int)CONCAT71(in_register_00000009,excludeFromAll) == 0) {
    no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&no_main_dependency,"EXCLUDE_FROM_ALL","");
    pcVar4 = GetProperty(local_a8,&no_main_dependency);
    bVar3 = cmSystemTools::IsOn(pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
      operator_delete(no_main_dependency._M_dataplus._M_p,
                      CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                               no_main_dependency.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar3) goto LAB_0017f61f;
  }
  no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&no_main_dependency,"EXCLUDE_FROM_ALL","");
  cmTarget::SetProperty(this_00,&no_main_dependency,"TRUE");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
    operator_delete(no_main_dependency._M_dataplus._M_p,
                    CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                             no_main_dependency.field_2._M_local_buf[0]) + 1);
  }
LAB_0017f61f:
  pcVar4 = "";
  if (comment != (char *)0x0) {
    pcVar4 = comment;
  }
  if (((commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((depends->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (depends->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&no_main_dependency,&local_a8->StateSnapshot);
    psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&no_main_dependency);
    force._M_dataplus._M_p = (pointer)&force.field_2;
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&force,pcVar1,pcVar1 + psVar5->_M_string_length);
    std::__cxx11::string::append((char *)&force);
    std::__cxx11::string::append((char *)&force);
    std::__cxx11::string::_M_append((char *)&force,(ulong)(utilityName->_M_dataplus)._M_p);
    forced.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    forced.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    forced.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&forced,&force);
    no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
    no_main_dependency._M_string_length = 0;
    no_main_dependency.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    AddCustomCommandToOutput
              (local_a8,&forced,byproducts,depends,&no_main_dependency,commandLines,pcVar4,
               workingDirectory,false,escapeOldStyle,uses_terminal,command_expand_lists,&local_c8,
               job_pool);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = cmTarget::AddSourceCMP0049(this_00,&force);
    if (pcVar6 == (cmSourceFile *)0x0) {
      std::operator+(&local_c8,"Could not get source file entry for ",&force);
      cmSystemTools::Error(&local_c8);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SYMBOLIC","");
      cmSourceFile::SetProperty(pcVar6,&local_c8,"1");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    psVar2 = (byproducts->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (byproducts->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1)
    {
      pcVar6 = GetOrCreateSource(local_a8,psVar5,true,Known);
      if (pcVar6 != (cmSourceFile *)0x0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GENERATED","");
        cmSourceFile::SetProperty(pcVar6,&local_c8,"1");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
      operator_delete(no_main_dependency._M_dataplus._M_p,
                      CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                               no_main_dependency.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&forced);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)force._M_dataplus._M_p != &force.field_2) {
      operator_delete(force._M_dataplus._M_p,force.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddUtilityCommand(
  const std::string& utilityName, TargetOrigin origin, bool excludeFromAll,
  const char* workingDirectory, const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends,
  const cmCustomCommandLines& commandLines, bool escapeOldStyle,
  const char* comment, bool uses_terminal, bool command_expand_lists,
  const std::string& job_pool)
{
  // Create a target instance for this utility.
  cmTarget* target = this->AddNewTarget(cmStateEnums::UTILITY, utilityName);
  target->SetIsGeneratorProvided(origin == TargetOrigin::Generator);
  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  if (!comment) {
    // Use an empty comment to avoid generation of default comment.
    comment = "";
  }

  // Store the custom command in the target.
  if (!commandLines.empty() || !depends.empty()) {
    std::string force = this->GetCurrentBinaryDirectory();
    force += "/CMakeFiles";
    force += "/";
    force += utilityName;
    std::vector<std::string> forced;
    forced.push_back(force);
    std::string no_main_dependency;
    bool no_replace = false;
    this->AddCustomCommandToOutput(
      forced, byproducts, depends, no_main_dependency, commandLines, comment,
      workingDirectory, no_replace, escapeOldStyle, uses_terminal,
      command_expand_lists, /*depfile=*/"", job_pool);
    cmSourceFile* sf = target->AddSourceCMP0049(force);

    // The output is not actually created so mark it symbolic.
    if (sf) {
      sf->SetProperty("SYMBOLIC", "1");
    } else {
      cmSystemTools::Error("Could not get source file entry for " + force);
    }

    // Always create the byproduct sources and mark them generated.
    for (std::string const& byproduct : byproducts) {
      if (cmSourceFile* out = this->GetOrCreateSource(
            byproduct, true, cmSourceFileLocationKind::Known)) {
        out->SetProperty("GENERATED", "1");
      }
    }
  }
  return target;
}